

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_cargo_zero_or_one_without_arg2(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  int a;
  int b;
  char *args [4];
  cargo_t local_48;
  int local_40 [2];
  undefined8 local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  char *local_28;
  char *pcStack_20;
  
  iVar1 = cargo_init(&local_48,0,"program");
  if (iVar1 == 0) {
    local_28 = "--beta";
    pcStack_20 = "3";
    local_38._0_4_ = 0x12ab1a;
    local_38._4_4_ = 0;
    uStack_30 = 0x127e2d;
    uStack_2c = 0;
    local_40[0] = 0;
    local_40[1] = 0;
    cargo_add_option(local_48,0,"--alpha","an option","i?",local_40,"5");
    iVar1 = cargo_add_option(local_48,0,"--beta -b","an option","i",local_40 + 1);
    if (iVar1 == 0) {
      iVar1 = cargo_parse(local_48,0,1,4,(char **)&local_38);
      if (iVar1 == 0) {
        pcVar2 = (char *)0x0;
        if (local_40[0] != 5) {
          pcVar2 = "Unexpected value";
        }
      }
      else {
        pcVar2 = "Failed parse";
      }
    }
    else {
      pcVar2 = "Failed to add options";
    }
    cargo_destroy(&local_48);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_cargo_zero_or_one_without_arg2)
{
    char *args[] = { "program", "--alpha", "--beta", "3" };
    int a = 0;
    int b = 0;
    ret = cargo_add_option(cargo, 0, "--alpha", "an option", "i?", &a, "5");
    ret = cargo_add_option(cargo, 0, "--beta -b", "an option", "i", &b);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Failed parse");
    cargo_assert(a == 5, "Unexpected value");

    _TEST_CLEANUP();
}